

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O2

int aes256ctr_setup(ptls_cipher_context_t *ctx,int is_enc,void *key)

{
  size_t in_RCX;
  
  aesctr_setup(ctx,(int)key,(void *)0x20,in_RCX);
  return 0;
}

Assistant:

static int aes256ctr_setup(ptls_cipher_context_t *ctx, int is_enc, const void *key)
{
    return aesctr_setup(ctx, is_enc, key, PTLS_AES256_KEY_SIZE);
}